

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O0

uint JsUtil::NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode_*>::GetHashCode
               (CaseInvariantPropertyListWithHashCode *list)

{
  code *pcVar1;
  bool bVar2;
  charcount_t len;
  hash_t hVar3;
  undefined4 *puVar4;
  RecyclerWeakReference<const_Js::PropertyRecord> *this;
  char16 *string_00;
  undefined1 local_30 [8];
  CharacterBuffer<char16_t> string;
  PropertyRecord *prop;
  RecyclerWeakReference<const_Js::PropertyRecord> *propRecordWeakRef;
  CaseInvariantPropertyListWithHashCode *list_local;
  
  if (list == (CaseInvariantPropertyListWithHashCode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                       ,0xef,"(list != nullptr)","list != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((*(int *)&(list->
                super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ).field_0x2c == 0) &&
     (this = List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::CompactEnd<true>(&list->
                                 super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                               ), this != (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0)) {
    string._8_8_ = Memory::RecyclerWeakReference<const_Js::PropertyRecord>::Get(this);
    if ((PropertyRecord *)string._8_8_ == (PropertyRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                         ,0xf9,"(prop)","prop");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    string_00 = Js::PropertyRecord::GetBuffer((PropertyRecord *)string._8_8_);
    len = Js::PropertyRecord::GetLength((PropertyRecord *)string._8_8_);
    CharacterBuffer<char16_t>::CharacterBuffer((CharacterBuffer<char16_t> *)local_30,string_00,len);
    hVar3 = NoCaseComparer<JsUtil::CharacterBuffer<char16_t>_>::GetHashCode
                      ((CharacterBuffer<char16_t> *)local_30);
    *(hash_t *)
     &(list->
      super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ).field_0x2c = hVar3;
  }
  return *(uint *)&(list->
                   super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ).field_0x2c;
}

Assistant:

uint NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode*>::GetHashCode(_In_ Js::CaseInvariantPropertyListWithHashCode* list)
    {
        Assert(list != nullptr);

        if (list->caseInvariantHashCode == 0)
        {
            const RecyclerWeakReference<Js::PropertyRecord const>* propRecordWeakRef = list->CompactEnd<true>();

            if (propRecordWeakRef != nullptr)
            {
                const Js::PropertyRecord* prop = propRecordWeakRef->Get();

                Assert(prop);

                JsUtil::CharacterBuffer<WCHAR> string(prop->GetBuffer(), prop->GetLength());

                list->caseInvariantHashCode = NoCaseComparer<JsUtil::CharacterBuffer<WCHAR> >::GetHashCode(string);
            }
        }

        return list->caseInvariantHashCode;
    }